

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

Matrix * __thiscall Matrix::transpose(Matrix *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *p;
  ulong uVar5;
  MatrixDataDeleter local_69;
  shared_array<double> local_68;
  int local_54;
  int local_50;
  int j_1;
  int newOffset;
  int j;
  int remainder;
  int i_2;
  int i_1;
  int m;
  int *newMult;
  int *piStack_28;
  int i;
  int *newSize;
  double *newData;
  int *indexes;
  Matrix *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->nMatrixDimension;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  indexes = (int *)this;
  newData = (double *)operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->nData;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  newSize = (int *)operator_new__(uVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->nMatrixDimension;
  uVar5 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piStack_28 = (int *)operator_new__(uVar5);
  for (newMult._4_4_ = 0; newMult._4_4_ < this->nMatrixDimension; newMult._4_4_ = newMult._4_4_ + 1)
  {
    piStack_28[newMult._4_4_] = this->pSize[(this->nMatrixDimension - newMult._4_4_) + -1];
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->nMatrixDimension;
  uVar5 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  _i_1 = (int *)operator_new__(uVar5);
  i_2 = 1;
  remainder = this->nMatrixDimension;
  while (remainder = remainder + -1, remainder != -1) {
    _i_1[remainder] = i_2;
    i_2 = piStack_28[remainder] * i_2;
  }
  for (j = 0; j < this->nData; j = j + 1) {
    newOffset = j;
    for (j_1 = 0; j_1 < this->nMatrixDimension; j_1 = j_1 + 1) {
      *(int *)((long)newData + (long)j_1 * 4) = newOffset / this->pMult[j_1];
      newOffset = newOffset - *(int *)((long)newData + (long)j_1 * 4) * this->pMult[j_1];
    }
    local_50 = 0;
    for (local_54 = 0; local_54 < this->nMatrixDimension; local_54 = local_54 + 1) {
      local_50 = *(int *)((long)newData + (long)((this->nMatrixDimension - local_54) + -1) * 4) *
                 _i_1[local_54] + local_50;
    }
    *(double *)(newSize + (long)local_50 * 2) = this->pData[j];
  }
  if (this->pMult != (int *)0x0) {
    operator_delete__(this->pMult);
  }
  this->pMult = _i_1;
  if (this->pSize != (int *)0x0) {
    operator_delete__(this->pSize);
  }
  p = newSize;
  this->pSize = piStack_28;
  this->pData = (double *)newSize;
  MatrixDataDeleter::MatrixDataDeleter(&local_69,this);
  boost::shared_array<double>::shared_array<double,MatrixDataDeleter>
            (&local_68,(double *)p,local_69);
  boost::shared_array<double>::operator=(&this->matrixParent,&local_68);
  boost::shared_array<double>::~shared_array(&local_68);
  return this;
}

Assistant:

Matrix &Matrix::transpose()
{
	int *indexes = new int[nMatrixDimension]; // array with indexes
	double *newData = new double[nData]; // array for re-arranged values
	
	// array with new shape
	int *newSize = new int[nMatrixDimension]; 
	for( int i=0; i<nMatrixDimension; i++ )
		newSize[i] = pSize[nMatrixDimension- i-1];
	
	// array with new multipliers
	int *newMult = new int[nMatrixDimension];
	int m = 1;
	for(int i=nMatrixDimension-1; i+1; i--) {
		newMult[i] = m;
		m *= newSize[i];
	}
	
	for( int i=0; i<nData; i++ ) {
		// find index of data i
		int remainder = i;
		for( int j=0; j<nMatrixDimension; j++) {
			indexes[j] = remainder / pMult[j];
			remainder -= indexes[j] * pMult[j]; // modulo :-)
		}
		// find new offset by re-interpreting index
		int newOffset = 0;
		for( int j=0; j<nMatrixDimension; j++)
			newOffset += indexes[nMatrixDimension-j-1] * newMult[j];
		// write into new position
		newData[ newOffset ] = pData[i];
	}	
	
	// save new data
	delete[] pMult;
	pMult = newMult;
	delete[] pSize;
	pSize = newSize;
	pData = newData;
	matrixParent = shared_array<double>(newData, MatrixDataDeleter(this));
	
	// bye.
	return *this;
}